

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yebash.cpp
# Opt level: O0

void printSuggestion(HistorySuggestion *history,Printer *printer,LineBuffer *buffer,int offset)

{
  bool bVar1;
  Color color;
  char *__s;
  long lVar2;
  long lVar3;
  optional<Color> *this;
  undefined1 local_88 [8];
  StringOpt suggestion;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string pattern;
  int offset_local;
  LineBuffer *buffer_local;
  Printer *printer_local;
  HistorySuggestion *history_local;
  
  pattern.field_2._12_4_ = offset;
  __s = yb::LineBuffer::get(buffer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  if (pattern.field_2._12_4_ == 0) {
    yb::HistorySuggestion::findNextSuggestion((StringOpt *)local_88,history,(string *)local_48);
  }
  else {
    yb::HistorySuggestion::findSuggestion((StringOpt *)local_88,history,(string *)local_48);
  }
  bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool((optional *)local_88);
  if (bVar1) {
    lVar2 = std::__cxx11::string::length();
    std::experimental::fundamentals_v1::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_88);
    lVar3 = std::__cxx11::string::length();
    if (lVar2 != lVar3) {
      std::experimental::fundamentals_v1::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_88);
      lVar2 = std::__cxx11::string::c_str();
      lVar3 = std::__cxx11::string::length();
      this = (optional<Color> *)__tls_get_addr(&PTR_00136f00);
      color = std::experimental::fundamentals_v1::optional<Color>::value_or<Color_const&>
                        (this,&defaultSuggestionColor);
      yb::Printer::print(printer,(char *)(lVar2 + lVar3),color,pattern.field_2._12_4_);
    }
  }
  else {
    yb::Printer::clearTerminalLine(printer);
  }
  std::experimental::fundamentals_v1::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_88);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void printSuggestion(HistorySuggestion &history, Printer &printer, LineBuffer &buffer, int offset) {
    std::string pattern{buffer.get()};
    auto suggestion = offset ? history.findSuggestion(pattern) : history.findNextSuggestion(pattern);
    if (!suggestion) {
        printer.clearTerminalLine();
        return;
    }
    if (pattern.length() == suggestion.value().length()) {
        return;
    }
    printer.print(suggestion.value().c_str() + pattern.length(), suggestionColor.value_or(defaultSuggestionColor), offset);
}